

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntBounds.cpp
# Opt level: O0

bool __thiscall IntBounds::RequiresIntBoundedValueInfo(IntBounds *this,ValueType valueType)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  bool local_21;
  IntBounds *this_local;
  ValueType valueType_local;
  
  this_local._6_2_ = valueType.field_0;
  bVar2 = ValueType::IsLikelyInt((ValueType *)((long)&this_local + 6));
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IntBounds.cpp"
                       ,0x39,"(valueType.IsLikelyInt())","valueType.IsLikelyInt()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = ValueType::IsInt((ValueType *)((long)&this_local + 6));
  local_21 = true;
  if (bVar2) {
    local_21 = RequiresIntBoundedValueInfo(this);
  }
  return local_21;
}

Assistant:

bool IntBounds::RequiresIntBoundedValueInfo(const ValueType valueType) const
{
    Assert(valueType.IsLikelyInt());
    return !valueType.IsInt() || RequiresIntBoundedValueInfo();
}